

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

_Bool square_isempty(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  object *poVar2;
  
  _Var1 = square_isplayertrap(c,grid);
  if (((!_Var1) && (_Var1 = square_iswebbed(c,grid), !_Var1)) &&
     (_Var1 = square_isopen(c,grid), _Var1)) {
    poVar2 = square_object(c,grid);
    return poVar2 == (object *)0x0;
  }
  return false;
}

Assistant:

bool square_isempty(struct chunk *c, struct loc grid) {
	if (square_isplayertrap(c, grid)) return false;
	if (square_iswebbed(c, grid)) return false;
	return square_isopen(c, grid) && !square_object(c, grid);
}